

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_CCtx_refPrefix(ZSTD_CCtx *cctx,void *prefix,size_t prefixSize)

{
  if (cctx->streamStage != zcss_init) {
    return 0xffffffffffffffc4;
  }
  cctx->cdict = (ZSTD_CDict *)0x0;
  (cctx->prefixDict).dict = prefix;
  (cctx->prefixDict).dictSize = prefixSize;
  (cctx->prefixDict).dictContentType = ZSTD_dct_rawContent;
  return 0;
}

Assistant:

size_t ZSTD_CCtx_refPrefix(ZSTD_CCtx* cctx, const void* prefix, size_t prefixSize)
{
    return ZSTD_CCtx_refPrefix_advanced(cctx, prefix, prefixSize, ZSTD_dct_rawContent);
}